

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeStrideCase::test
          (VertexAttributeStrideCase *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  GLenum GVar4;
  long lVar5;
  ScopedLogSection section;
  GLfloat vertexData [4];
  StridePointerData pointers [9];
  ScopedLogSection local_130;
  string local_128;
  string local_108;
  undefined4 local_e8;
  string *local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  string *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  string *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  string *local_98;
  undefined8 local_90;
  undefined4 local_88;
  string *local_80;
  undefined8 local_78;
  undefined4 local_70;
  string *local_68;
  undefined8 local_60;
  undefined4 local_58;
  string *local_50;
  undefined8 local_48;
  undefined4 local_40;
  string *local_38;
  
  pTVar2 = (this->super_ApiCase).m_log;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"DefaultVAO","");
  paVar1 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Test with default VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_130,pTVar2,&local_108,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_128._M_dataplus._M_p = (pointer)0x0;
  local_128._M_string_length = 0;
  local_108._M_dataplus._M_p = (pointer)0x140600000001;
  local_108._M_string_length._0_4_ = 0;
  local_108.field_2._M_allocated_capacity = (size_type)&local_128;
  local_108.field_2._8_8_ = 0x140600000001;
  local_e8 = 1;
  local_e0 = &local_128;
  local_d8 = 0x140600000001;
  local_d0 = 4;
  local_c8 = &local_128;
  local_c0 = 0x140b00000001;
  local_b8 = 0;
  local_b0 = &local_128;
  local_a8 = 0x140b00000001;
  local_a0 = 1;
  local_98 = &local_128;
  local_90 = 0x140b00000001;
  local_88 = 4;
  local_80 = &local_128;
  local_78 = 0x140c00000001;
  local_70 = 0;
  local_68 = &local_128;
  local_60 = 0x140c00000001;
  local_58 = 1;
  local_50 = &local_128;
  local_48 = 0x140c00000001;
  local_40 = 4;
  local_38 = &local_128;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  lVar5 = 0x10;
  do {
    GVar4 = *(GLenum *)((long)&local_128.field_2 + lVar5 + 8);
    GVar3 = 0;
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)&local_128.field_2 + lVar5),
               *(GLenum *)((long)&local_128.field_2 + lVar5 + 4),'\0',GVar4,
               *(void **)((long)&local_108._M_dataplus._M_p + lVar5));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8624,GVar4,GVar3);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xe8);
  local_108._M_dataplus._M_p = (pointer)0x140400000001;
  local_108._M_string_length._0_4_ = 0;
  local_108.field_2._M_allocated_capacity = (size_type)&local_128;
  local_108.field_2._8_8_ = 0x140400000001;
  local_e8 = 1;
  local_e0 = &local_128;
  local_d8 = 0x140400000001;
  local_d0 = 4;
  local_c8 = &local_128;
  local_c0 = 0x140100000004;
  local_b8 = 0;
  local_b0 = &local_128;
  local_a8 = 0x140100000004;
  local_a0 = 1;
  local_98 = &local_128;
  local_90 = 0x140100000004;
  local_88 = 4;
  local_80 = &local_128;
  local_78 = 0x140200000002;
  local_70 = 0;
  local_68 = &local_128;
  local_60 = 0x140200000002;
  local_58 = 1;
  local_50 = &local_128;
  local_48 = 0x140200000002;
  local_40 = 4;
  local_38 = &local_128;
  lVar5 = 0x10;
  do {
    GVar4 = *(GLenum *)((long)&local_128.field_2 + lVar5 + 8);
    GVar3 = GVar4;
    glu::CallLogWrapper::glVertexAttribIPointer
              (this_00,0,*(GLint *)((long)&local_128.field_2 + lVar5),
               *(GLenum *)((long)&local_128.field_2 + lVar5 + 4),GVar4,
               *(void **)((long)&local_108._M_dataplus._M_p + lVar5));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8624,GVar4,GVar3);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xe8);
  tcu::TestLog::endSection(local_130.m_log);
  pTVar2 = (this->super_ApiCase).m_log;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"WithVAO","");
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Test with VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_130,pTVar2,&local_108,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,(ulong)(local_108.field_2._M_allocated_capacity + 1))
    ;
  }
  local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffff00000000;
  local_108._M_dataplus._M_p = (pointer)0x0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,(GLuint *)&local_108);
  glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&local_128);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)local_128._M_dataplus._M_p);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_108._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8624,0,GVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1406,'\0',4,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,local_108._M_dataplus._M_p._4_4_);
  GVar4 = 0;
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1402,'\0',8,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8624,8,GVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_108._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8624,4,GVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,(GLuint *)&local_108);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&local_128);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::TestLog::endSection(local_130.m_log);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			const GLfloat vertexData[4] = {0.0f}; // never accessed

			struct StridePointerData
			{
				GLint		size;
				GLenum		type;
				GLint		stride;
				const void*	pointer;
			};

			// test VertexAttribPointer
			{
				const StridePointerData pointers[] =
				{
					{ 1, GL_FLOAT,			0,	vertexData },
					{ 1, GL_FLOAT,			1,	vertexData },
					{ 1, GL_FLOAT,			4,	vertexData },
					{ 1, GL_HALF_FLOAT,		0,	vertexData },
					{ 1, GL_HALF_FLOAT,		1,	vertexData },
					{ 1, GL_HALF_FLOAT,		4,	vertexData },
					{ 1, GL_FIXED,			0,	vertexData },
					{ 1, GL_FIXED,			1,	vertexData },
					{ 1, GL_FIXED,			4,	vertexData },
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, GL_FALSE, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, pointers[ndx].stride);
				}
			}

			// test glVertexAttribIPointer
			{
				const StridePointerData pointers[] =
				{
					{ 1, GL_INT,				0,	vertexData },
					{ 1, GL_INT,				1,	vertexData },
					{ 1, GL_INT,				4,	vertexData },
					{ 4, GL_UNSIGNED_BYTE,		0,	vertexData },
					{ 4, GL_UNSIGNED_BYTE,		1,	vertexData },
					{ 4, GL_UNSIGNED_BYTE,		4,	vertexData },
					{ 2, GL_SHORT,				0,	vertexData },
					{ 2, GL_SHORT,				1,	vertexData },
					{ 2, GL_SHORT,				4,	vertexData },
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribIPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, pointers[ndx].stride);
				}
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, 0);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, 1, GL_FLOAT, GL_FALSE, 4, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, 1, GL_SHORT, GL_FALSE, 8, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, 8);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, 4);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}